

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHull.cpp
# Opt level: O1

int maxdirsterid<btVector3>(btVector3 *p,int count,btVector3 *dir,btAlignedObjectArray<int> *allow)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int unaff_EBP;
  bool bVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dd;
  float fVar11;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  btVector3 bVar12;
  int local_c4;
  int local_b4;
  btVector3 local_88;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  undefined1 local_48 [24];
  
  do {
    iVar4 = maxdirfiltered<btVector3>(p,count,dir,allow);
    if (allow->m_data[iVar4] == 3) {
      return iVar4;
    }
    bVar12 = orth(dir);
    fVar11 = bVar12.m_floats[1];
    fVar8 = (float)*(undefined8 *)(dir->m_floats + 1);
    fVar9 = (float)((ulong)*(undefined8 *)(dir->m_floats + 1) >> 0x20);
    local_58._8_4_ = in_XMM1_Dc;
    local_58._0_8_ = bVar12.m_floats._8_8_;
    local_58._12_4_ = in_XMM1_Dd;
    local_78 = fVar9 * fVar11 - bVar12.m_floats[2] * fVar8;
    fStack_74 = dir->m_floats[0] * bVar12.m_floats[2] - bVar12.m_floats[0] * fVar9;
    fStack_70 = fVar9 * extraout_XMM0_Dc - bVar12.m_floats[3] * 0.0;
    fStack_6c = fVar9 * extraout_XMM0_Dd - fVar11 * 0.0;
    local_48._8_4_ = extraout_XMM0_Dc;
    local_48._0_8_ = bVar12.m_floats._0_8_;
    local_48._12_4_ = extraout_XMM0_Dd;
    local_68 = CONCAT44(fVar9,fVar8 * bVar12.m_floats[0] - fVar11 * dir->m_floats[0]);
    uStack_60 = 0;
    local_c4 = -1;
    fVar11 = 0.0;
    bVar1 = false;
    do {
      fVar8 = sinf(fVar11 * 0.017453292);
      fVar9 = cosf(fVar11 * 0.017453292);
      local_88.m_floats[1] =
           (float)((ulong)*(undefined8 *)dir->m_floats >> 0x20) +
           (fVar9 * fStack_74 + fVar8 * (float)local_48._4_4_) * 0.025;
      local_88.m_floats[0] =
           (float)*(undefined8 *)dir->m_floats +
           (fVar9 * local_78 + fVar8 * (float)local_48._0_4_) * 0.025;
      local_88.m_floats[2] =
           ((float)local_68 * fVar9 + (float)local_58._0_4_ * fVar8) * 0.025 + dir->m_floats[2];
      local_88.m_floats[3] = 0.0;
      iVar5 = maxdirfiltered<btVector3>(p,count,&local_88,allow);
      if (iVar5 == iVar4 && local_c4 == iVar4) {
        allow->m_data[iVar4] = 3;
        bVar7 = false;
        unaff_EBP = iVar4;
      }
      else if (local_c4 == iVar5 || local_c4 == -1) {
        bVar7 = true;
        local_c4 = iVar5;
      }
      else {
        bVar7 = true;
        iVar3 = local_c4;
        for (fVar8 = fVar11 + -40.0; bVar2 = fVar11 < fVar8, local_b4 = unaff_EBP, !bVar2;
            fVar8 = fVar8 + 5.0) {
          fVar9 = sinf(fVar8 * 0.017453292);
          fVar10 = cosf(fVar8 * 0.017453292);
          local_88.m_floats[1] =
               (float)((ulong)*(undefined8 *)dir->m_floats >> 0x20) +
               (fVar10 * fStack_74 + fVar9 * (float)local_48._4_4_) * 0.025;
          local_88.m_floats[0] =
               (float)*(undefined8 *)dir->m_floats +
               (fVar10 * local_78 + fVar9 * (float)local_48._0_4_) * 0.025;
          local_88.m_floats[2] =
               ((float)local_68 * fVar10 + (float)local_58._0_4_ * fVar9) * 0.025 + dir->m_floats[2]
          ;
          local_88.m_floats[3] = 0.0;
          iVar6 = maxdirfiltered<btVector3>(p,count,&local_88,allow);
          bVar7 = iVar6 != iVar4 || iVar3 != iVar4;
          if (iVar6 == iVar4 && iVar3 == iVar4) {
            allow->m_data[iVar4] = 3;
            local_b4 = iVar4;
            break;
          }
          iVar3 = iVar6;
        }
        if (bVar2) {
          local_c4 = iVar5;
        }
        bVar7 = (bool)(bVar7 | bVar2);
        unaff_EBP = local_b4;
      }
      in_XMM1_Dd = 0;
      in_XMM1_Dc = 0;
      if (!bVar7) break;
      fVar11 = fVar11 + 45.0;
      bVar1 = 360.0 < fVar11;
    } while (!bVar1);
    if (!bVar1) {
      return unaff_EBP;
    }
    allow->m_data[iVar4] = 0;
  } while( true );
}

Assistant:

int maxdirsterid(const T *p,int count,const T &dir,btAlignedObjectArray<int> &allow)
{
	int m=-1;
	while(m==-1)
	{
		m = maxdirfiltered(p,count,dir,allow);
		if(allow[m]==3) return m;
		T u = orth(dir);
		T v = btCross(u,dir);
		int ma=-1;
		for(btScalar x = btScalar(0.0) ; x<= btScalar(360.0) ; x+= btScalar(45.0))
		{
			btScalar s = btSin(SIMD_RADS_PER_DEG*(x));
			btScalar c = btCos(SIMD_RADS_PER_DEG*(x));
			int mb = maxdirfiltered(p,count,dir+(u*s+v*c)*btScalar(0.025),allow);
			if(ma==m && mb==m)
			{
				allow[m]=3;
				return m;
			}
			if(ma!=-1 && ma!=mb)  // Yuck - this is really ugly
			{
				int mc = ma;
				for(btScalar xx = x-btScalar(40.0) ; xx <= x ; xx+= btScalar(5.0))
				{
					btScalar s = btSin(SIMD_RADS_PER_DEG*(xx));
					btScalar c = btCos(SIMD_RADS_PER_DEG*(xx));
					int md = maxdirfiltered(p,count,dir+(u*s+v*c)*btScalar(0.025),allow);
					if(mc==m && md==m)
					{
						allow[m]=3;
						return m;
					}
					mc=md;
				}
			}
			ma=mb;
		}
		allow[m]=0;
		m=-1;
	}
	btAssert(0);
	return m;
}